

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void gen_exception_insn(DisasContext_conflict1 *s,uint64_t pc,int excp,uint32_t syndrome,
                       uint32_t target_el)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t target_el_local;
  uint32_t syndrome_local;
  int excp_local;
  uint64_t pc_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  gen_a64_set_pc_im_aarch64(tcg_ctx_00,pc);
  gen_exception(tcg_ctx_00,excp,syndrome,target_el);
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_exception_insn(DisasContext *s, uint64_t pc, int excp,
                               uint32_t syndrome, uint32_t target_el)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_a64_set_pc_im(tcg_ctx, pc);
    gen_exception(tcg_ctx, excp, syndrome, target_el);
    s->base.is_jmp = DISAS_NORETURN;
}